

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O0

REF_STATUS ref_fixture_hanging_hex_pri_grid(REF_GRID *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID pRVar1;
  REF_NODE ref_node_00;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node;
  REF_INT cell;
  REF_INT nodes [8];
  REF_NODE ref_node;
  REF_GRID ref_grid;
  REF_MPI ref_mpi_local;
  REF_GRID *ref_grid_ptr_local;
  
  _node = 0x100000000;
  nodes[0] = 2;
  nodes[1] = 3;
  nodes[2] = 4;
  nodes[3] = 5;
  nodes[4] = 6;
  nodes[5] = 7;
  ref_grid_ptr_local._4_4_ = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (ref_grid_ptr_local._4_4_ == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node_00 = pRVar1->node;
    ref_grid_ptr_local._4_4_ = ref_node_add(ref_node_00,0,&ref_private_macro_code_rss_1);
    if (ref_grid_ptr_local._4_4_ == 0) {
      ref_node_00->real[ref_private_macro_code_rss_1 * 0xf] = 0.0;
      ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 1] = 0.0;
      ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 2] = 0.0;
      ref_grid_ptr_local._4_4_ = ref_node_add(ref_node_00,1,&ref_private_macro_code_rss_1);
      if (ref_grid_ptr_local._4_4_ == 0) {
        ref_node_00->real[ref_private_macro_code_rss_1 * 0xf] = 1.0;
        ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 1] = 0.0;
        ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 2] = 0.0;
        ref_grid_ptr_local._4_4_ = ref_node_add(ref_node_00,2,&ref_private_macro_code_rss_1);
        if (ref_grid_ptr_local._4_4_ == 0) {
          ref_node_00->real[ref_private_macro_code_rss_1 * 0xf] = 1.0;
          ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 1] = 1.0;
          ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 2] = 0.0;
          ref_grid_ptr_local._4_4_ = ref_node_add(ref_node_00,3,&ref_private_macro_code_rss_1);
          if (ref_grid_ptr_local._4_4_ == 0) {
            ref_node_00->real[ref_private_macro_code_rss_1 * 0xf] = 0.0;
            ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 1] = 1.0;
            ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 2] = 0.0;
            ref_grid_ptr_local._4_4_ = ref_node_add(ref_node_00,4,&ref_private_macro_code_rss_1);
            if (ref_grid_ptr_local._4_4_ == 0) {
              ref_node_00->real[ref_private_macro_code_rss_1 * 0xf] = 0.0;
              ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 1] = 0.0;
              ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 2] = 1.0;
              ref_grid_ptr_local._4_4_ = ref_node_add(ref_node_00,5,&ref_private_macro_code_rss_1);
              if (ref_grid_ptr_local._4_4_ == 0) {
                ref_node_00->real[ref_private_macro_code_rss_1 * 0xf] = 1.0;
                ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 1] = 0.0;
                ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 2] = 1.0;
                ref_grid_ptr_local._4_4_ = ref_node_add(ref_node_00,6,&ref_private_macro_code_rss_1)
                ;
                if (ref_grid_ptr_local._4_4_ == 0) {
                  ref_node_00->real[ref_private_macro_code_rss_1 * 0xf] = 1.0;
                  ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 1] = 1.0;
                  ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 2] = 1.0;
                  ref_grid_ptr_local._4_4_ =
                       ref_node_add(ref_node_00,7,&ref_private_macro_code_rss_1);
                  if (ref_grid_ptr_local._4_4_ == 0) {
                    ref_node_00->real[ref_private_macro_code_rss_1 * 0xf] = 0.0;
                    ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 1] = 1.0;
                    ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 2] = 1.0;
                    ref_grid_ptr_local._4_4_ =
                         ref_cell_add(pRVar1->cell[0xb],&node,&ref_private_macro_code_rss);
                    if (ref_grid_ptr_local._4_4_ == 0) {
                      _node = 0x100000000;
                      nodes[0] = 2;
                      nodes[1] = 3;
                      nodes[2] = 10;
                      ref_grid_ptr_local._4_4_ =
                           ref_cell_add(pRVar1->cell[6],&node,&ref_private_macro_code_rss);
                      if (ref_grid_ptr_local._4_4_ == 0) {
                        _node = 0x500000001;
                        nodes[0] = 6;
                        nodes[1] = 2;
                        nodes[2] = 10;
                        ref_grid_ptr_local._4_4_ =
                             ref_cell_add(pRVar1->cell[6],&node,&ref_private_macro_code_rss);
                        if (ref_grid_ptr_local._4_4_ == 0) {
                          _node = 0x300000000;
                          nodes[0] = 7;
                          nodes[1] = 4;
                          nodes[2] = 10;
                          ref_grid_ptr_local._4_4_ =
                               ref_cell_add(pRVar1->cell[6],&node,&ref_private_macro_code_rss);
                          if (ref_grid_ptr_local._4_4_ == 0) {
                            _node = 0x400000000;
                            nodes[0] = 5;
                            nodes[1] = 1;
                            nodes[2] = 10;
                            ref_grid_ptr_local._4_4_ =
                                 ref_cell_add(pRVar1->cell[6],&node,&ref_private_macro_code_rss);
                            if (ref_grid_ptr_local._4_4_ == 0) {
                              _node = 0x600000002;
                              nodes[0] = 7;
                              nodes[1] = 3;
                              nodes[2] = 10;
                              ref_grid_ptr_local._4_4_ =
                                   ref_cell_add(pRVar1->cell[6],&node,&ref_private_macro_code_rss);
                              if (ref_grid_ptr_local._4_4_ == 0) {
                                ref_grid_ptr_local._4_4_ =
                                     ref_node_add(ref_node_00,8,&ref_private_macro_code_rss_1);
                                if (ref_grid_ptr_local._4_4_ == 0) {
                                  ref_node_00->real[ref_private_macro_code_rss_1 * 0xf] = 0.0;
                                  ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 1] = 0.0;
                                  ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 2] = 2.0;
                                  ref_grid_ptr_local._4_4_ =
                                       ref_node_add(ref_node_00,9,&ref_private_macro_code_rss_1);
                                  if (ref_grid_ptr_local._4_4_ == 0) {
                                    ref_node_00->real[ref_private_macro_code_rss_1 * 0xf] = 1.0;
                                    ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 1] = 0.0;
                                    ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 2] = 2.0;
                                    ref_grid_ptr_local._4_4_ =
                                         ref_node_add(ref_node_00,10,&ref_private_macro_code_rss_1);
                                    if (ref_grid_ptr_local._4_4_ == 0) {
                                      ref_node_00->real[ref_private_macro_code_rss_1 * 0xf] = 1.0;
                                      ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 1] =
                                           1.0;
                                      ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 2] =
                                           2.0;
                                      ref_grid_ptr_local._4_4_ =
                                           ref_node_add(ref_node_00,0xb,
                                                        &ref_private_macro_code_rss_1);
                                      if (ref_grid_ptr_local._4_4_ == 0) {
                                        ref_node_00->real[ref_private_macro_code_rss_1 * 0xf] = 0.0;
                                        ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 1] =
                                             1.0;
                                        ref_node_00->real[ref_private_macro_code_rss_1 * 0xf + 2] =
                                             2.0;
                                        _node = 0x500000004;
                                        nodes[0] = 7;
                                        nodes[1] = 8;
                                        nodes[2] = 9;
                                        nodes[3] = 0xb;
                                        ref_grid_ptr_local._4_4_ =
                                             ref_cell_add(pRVar1->cell[10],&node,
                                                          &ref_private_macro_code_rss);
                                        if (ref_grid_ptr_local._4_4_ == 0) {
                                          _node = 0x600000005;
                                          nodes[0] = 7;
                                          nodes[1] = 9;
                                          nodes[2] = 10;
                                          nodes[3] = 0xb;
                                          ref_grid_ptr_local._4_4_ =
                                               ref_cell_add(pRVar1->cell[10],&node,
                                                            &ref_private_macro_code_rss);
                                          if (ref_grid_ptr_local._4_4_ == 0) {
                                            _node = 0x900000005;
                                            nodes[0] = 10;
                                            nodes[1] = 6;
                                            nodes[2] = 10;
                                            ref_grid_ptr_local._4_4_ =
                                                 ref_cell_add(pRVar1->cell[6],&node,
                                                              &ref_private_macro_code_rss);
                                            if (ref_grid_ptr_local._4_4_ == 0) {
                                              _node = 0x700000004;
                                              nodes[0] = 0xb;
                                              nodes[1] = 8;
                                              nodes[2] = 10;
                                              ref_grid_ptr_local._4_4_ =
                                                   ref_cell_add(pRVar1->cell[6],&node,
                                                                &ref_private_macro_code_rss);
                                              if (ref_grid_ptr_local._4_4_ == 0) {
                                                _node = 0x800000004;
                                                nodes[0] = 9;
                                                nodes[1] = 5;
                                                nodes[2] = 10;
                                                ref_grid_ptr_local._4_4_ =
                                                     ref_cell_add(pRVar1->cell[6],&node,
                                                                  &ref_private_macro_code_rss);
                                                if (ref_grid_ptr_local._4_4_ == 0) {
                                                  _node = 0xa00000006;
                                                  nodes[0] = 0xb;
                                                  nodes[1] = 7;
                                                  nodes[2] = 10;
                                                  ref_grid_ptr_local._4_4_ =
                                                       ref_cell_add(pRVar1->cell[6],&node,
                                                                    &ref_private_macro_code_rss);
                                                  if (ref_grid_ptr_local._4_4_ == 0) {
                                                    _node = 0xb00000008;
                                                    nodes[0] = 9;
                                                    nodes[1] = 10;
                                                    ref_grid_ptr_local._4_4_ =
                                                         ref_cell_add(pRVar1->cell[3],&node,
                                                                      &ref_private_macro_code_rss);
                                                    if (ref_grid_ptr_local._4_4_ == 0) {
                                                      _node = 0xb00000009;
                                                      nodes[0] = 10;
                                                      nodes[1] = 10;
                                                      ref_grid_ptr_local._4_4_ =
                                                           ref_cell_add(pRVar1->cell[3],&node,
                                                                        &ref_private_macro_code_rss)
                                                      ;
                                                      if (ref_grid_ptr_local._4_4_ == 0) {
                                                        ref_grid_ptr_local._4_4_ =
                                                             ref_node_initialize_n_global
                                                                       (ref_node_00,0xc);
                                                        if (ref_grid_ptr_local._4_4_ == 0) {
                                                          ref_grid_ptr_local._4_4_ = 0;
                                                        }
                                                        else {
                                                          printf("%s: %d: %s: %d %s\n",
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                                                  ,0x4dc,"ref_fixture_hanging_hex_pri_grid",
                                                  (ulong)ref_grid_ptr_local._4_4_,"init glob");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                                                  ,0x4da,"ref_fixture_hanging_hex_pri_grid",
                                                  (ulong)ref_grid_ptr_local._4_4_,"add quad");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                                                  ,0x4d4,"ref_fixture_hanging_hex_pri_grid",
                                                  (ulong)ref_grid_ptr_local._4_4_,"add quad");
                                                  }
                                                  }
                                                  else {
                                                    printf("%s: %d: %s: %d %s\n",
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                                                  ,0x4ce,"ref_fixture_hanging_hex_pri_grid",
                                                  (ulong)ref_grid_ptr_local._4_4_,"add quad");
                                                  }
                                                }
                                                else {
                                                  printf("%s: %d: %s: %d %s\n",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                                                  ,0x4c7,"ref_fixture_hanging_hex_pri_grid",
                                                  (ulong)ref_grid_ptr_local._4_4_,"add quad");
                                                }
                                              }
                                              else {
                                                printf("%s: %d: %s: %d %s\n",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                                                  ,0x4c0,"ref_fixture_hanging_hex_pri_grid",
                                                  (ulong)ref_grid_ptr_local._4_4_,"add quad");
                                              }
                                            }
                                            else {
                                              printf("%s: %d: %s: %d %s\n",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                                                  ,0x4b9,"ref_fixture_hanging_hex_pri_grid",
                                                  (ulong)ref_grid_ptr_local._4_4_,"add quad");
                                            }
                                          }
                                          else {
                                            printf("%s: %d: %s: %d %s\n",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                                                  ,0x4b2,"ref_fixture_hanging_hex_pri_grid",
                                                  (ulong)ref_grid_ptr_local._4_4_,"add quad");
                                          }
                                        }
                                        else {
                                          printf("%s: %d: %s: %d %s\n",
                                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                                                 ,0x4aa,"ref_fixture_hanging_hex_pri_grid",
                                                 (ulong)ref_grid_ptr_local._4_4_,"add quad");
                                        }
                                      }
                                      else {
                                        printf("%s: %d: %s: %d %s\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                                               ,0x49f,"ref_fixture_hanging_hex_pri_grid",
                                               (ulong)ref_grid_ptr_local._4_4_,"add node");
                                      }
                                    }
                                    else {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                                             ,0x49a,"ref_fixture_hanging_hex_pri_grid",
                                             (ulong)ref_grid_ptr_local._4_4_,"add node");
                                    }
                                  }
                                  else {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                                           ,0x495,"ref_fixture_hanging_hex_pri_grid",
                                           (ulong)ref_grid_ptr_local._4_4_,"add node");
                                  }
                                }
                                else {
                                  printf("%s: %d: %s: %d %s\n",
                                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                                         ,0x490,"ref_fixture_hanging_hex_pri_grid",
                                         (ulong)ref_grid_ptr_local._4_4_,"add node");
                                }
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                                       ,0x48e,"ref_fixture_hanging_hex_pri_grid",
                                       (ulong)ref_grid_ptr_local._4_4_,"add quad");
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                                     ,0x487,"ref_fixture_hanging_hex_pri_grid",
                                     (ulong)ref_grid_ptr_local._4_4_,"add quad");
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                                   ,0x480,"ref_fixture_hanging_hex_pri_grid",
                                   (ulong)ref_grid_ptr_local._4_4_,"add quad");
                          }
                        }
                        else {
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                                 ,0x479,"ref_fixture_hanging_hex_pri_grid",
                                 (ulong)ref_grid_ptr_local._4_4_,"add quad");
                        }
                      }
                      else {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                               ,0x469,"ref_fixture_hanging_hex_pri_grid",
                               (ulong)ref_grid_ptr_local._4_4_,"add quad");
                      }
                    }
                    else {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                             ,0x462,"ref_fixture_hanging_hex_pri_grid",
                             (ulong)ref_grid_ptr_local._4_4_,"add prism");
                    }
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                           ,0x45d,"ref_fixture_hanging_hex_pri_grid",(ulong)ref_grid_ptr_local._4_4_
                           ,"add node");
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                         ,0x458,"ref_fixture_hanging_hex_pri_grid",(ulong)ref_grid_ptr_local._4_4_,
                         "add node");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                       ,0x453,"ref_fixture_hanging_hex_pri_grid",(ulong)ref_grid_ptr_local._4_4_,
                       "add node");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                     ,0x44e,"ref_fixture_hanging_hex_pri_grid",(ulong)ref_grid_ptr_local._4_4_,
                     "add node");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                   ,0x449,"ref_fixture_hanging_hex_pri_grid",(ulong)ref_grid_ptr_local._4_4_,
                   "add node");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c"
                 ,0x444,"ref_fixture_hanging_hex_pri_grid",(ulong)ref_grid_ptr_local._4_4_,
                 "add node");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
               0x43f,"ref_fixture_hanging_hex_pri_grid",(ulong)ref_grid_ptr_local._4_4_,"add node");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x43a,"ref_fixture_hanging_hex_pri_grid",(ulong)ref_grid_ptr_local._4_4_,"add node");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",0x436
           ,"ref_fixture_hanging_hex_pri_grid",(ulong)ref_grid_ptr_local._4_4_,"create");
  }
  return ref_grid_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_hanging_hex_pri_grid(REF_GRID *ref_grid_ptr,
                                                    REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT nodes[8] = {0, 1, 2, 3, 4, 5, 6, 7};
  REF_INT cell, node;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  RSS(ref_node_add(ref_node, 0, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 1, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 2, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 3, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 4, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_node_add(ref_node, 5, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_node_add(ref_node, 6, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_node_add(ref_node, 7, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_cell_add(ref_grid_hex(ref_grid), nodes, &cell), "add prism");

  nodes[0] = 0;
  nodes[1] = 1;
  nodes[2] = 2;
  nodes[3] = 3;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  /*
  nodes[0] = 4;
  nodes[1] = 7;
  nodes[2] = 6;
  nodes[3] = 5;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");
  */

  nodes[0] = 1;
  nodes[1] = 5;
  nodes[2] = 6;
  nodes[3] = 2;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 0;
  nodes[1] = 3;
  nodes[2] = 7;
  nodes[3] = 4;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 0;
  nodes[1] = 4;
  nodes[2] = 5;
  nodes[3] = 1;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 2;
  nodes[1] = 6;
  nodes[2] = 7;
  nodes[3] = 3;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  RSS(ref_node_add(ref_node, 8, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 2.0;

  RSS(ref_node_add(ref_node, 9, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 2.0;

  RSS(ref_node_add(ref_node, 10, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 2.0;

  RSS(ref_node_add(ref_node, 11, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 2.0;

  nodes[0] = 4;
  nodes[1] = 5;
  nodes[2] = 7;
  nodes[3] = 8;
  nodes[4] = 9;
  nodes[5] = 11;
  RSS(ref_cell_add(ref_grid_pri(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 5;
  nodes[1] = 6;
  nodes[2] = 7;
  nodes[3] = 9;
  nodes[4] = 10;
  nodes[5] = 11;
  RSS(ref_cell_add(ref_grid_pri(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 5;
  nodes[1] = 9;
  nodes[2] = 10;
  nodes[3] = 6;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 4;
  nodes[1] = 7;
  nodes[2] = 11;
  nodes[3] = 8;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 4;
  nodes[1] = 8;
  nodes[2] = 9;
  nodes[3] = 5;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 6;
  nodes[1] = 10;
  nodes[2] = 11;
  nodes[3] = 7;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 8;
  nodes[1] = 11;
  nodes[2] = 9;
  nodes[3] = 10;
  RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 9;
  nodes[1] = 11;
  nodes[2] = 10;
  nodes[3] = 10;
  RSS(ref_cell_add(ref_grid_tri(ref_grid), nodes, &cell), "add quad");

  RSS(ref_node_initialize_n_global(ref_node, 12), "init glob");

  return REF_SUCCESS;
}